

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_type.c
# Opt level: O3

void al_convert_memory_bitmaps(void)

{
  _Bool _Var1;
  uint uVar2;
  int format;
  ALLEGRO_DISPLAY *pAVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  _AL_VECTOR copy;
  ALLEGRO_STATE backup;
  _AL_VECTOR local_450;
  ALLEGRO_STATE local_430;
  
  pAVar3 = al_get_current_display();
  if (pAVar3 != (ALLEGRO_DISPLAY *)0x0) {
    al_store_state(&local_430,2);
    al_lock_mutex(convert_bitmap_list.mutex);
    _al_vector_init(&local_450,8);
    if (convert_bitmap_list.bitmaps._size != 0) {
      uVar6 = 0;
      do {
        puVar4 = (undefined8 *)_al_vector_ref(&convert_bitmap_list.bitmaps,(uint)uVar6);
        puVar5 = (undefined8 *)_al_vector_alloc_back(&local_450);
        *puVar5 = *puVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < convert_bitmap_list.bitmaps._size);
    }
    _al_vector_free(&convert_bitmap_list.bitmaps);
    _al_vector_init(&convert_bitmap_list.bitmaps,8);
    if (local_450._size != 0) {
      uVar6 = 0;
      do {
        puVar4 = (undefined8 *)_al_vector_ref(&local_450,(uint)uVar6);
        uVar2 = al_get_bitmap_flags((ALLEGRO_BITMAP *)*puVar4);
        al_set_new_bitmap_flags(uVar2 & 0xfffffffe);
        format = al_get_bitmap_format((ALLEGRO_BITMAP *)*puVar4);
        al_set_new_bitmap_format(format);
        _Var1 = _al_trace_prefix("bitmap",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap_type.c"
                                 ,0x105,"al_convert_memory_bitmaps");
        if (_Var1) {
          _al_trace_suffix("converting memory bitmap %p to display bitmap\n",*puVar4);
        }
        al_convert_bitmap((ALLEGRO_BITMAP *)*puVar4);
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_450._size);
    }
    _al_vector_free(&local_450);
    al_unlock_mutex(convert_bitmap_list.mutex);
    al_restore_state(&local_430);
  }
  return;
}

Assistant:

void al_convert_memory_bitmaps(void)
{
   ALLEGRO_STATE backup;
   ALLEGRO_DISPLAY *display = al_get_current_display();
   _AL_VECTOR copy;
   size_t i;
   if (!display) return;
   
   al_store_state(&backup, ALLEGRO_STATE_NEW_BITMAP_PARAMETERS);

   al_lock_mutex(convert_bitmap_list.mutex);
   
   _al_vector_init(&copy, sizeof(ALLEGRO_BITMAP *));
   for (i = 0; i <  _al_vector_size(&convert_bitmap_list.bitmaps); i++) {
      ALLEGRO_BITMAP **bptr, **bptr2;
      bptr = _al_vector_ref(&convert_bitmap_list.bitmaps, i);
      bptr2 = _al_vector_alloc_back(&copy);
      *bptr2 = *bptr;
   }
   _al_vector_free(&convert_bitmap_list.bitmaps);
   _al_vector_init(&convert_bitmap_list.bitmaps, sizeof(ALLEGRO_BITMAP *));
   for (i = 0; i < _al_vector_size(&copy); i++) {
      ALLEGRO_BITMAP **bptr;
      int flags;
      bptr = _al_vector_ref(&copy, i);
      flags = al_get_bitmap_flags(*bptr);
      flags &= ~ALLEGRO_MEMORY_BITMAP;
      al_set_new_bitmap_flags(flags);
      al_set_new_bitmap_format(al_get_bitmap_format(*bptr));
      
      ALLEGRO_DEBUG("converting memory bitmap %p to display bitmap\n", *bptr);
      
      al_convert_bitmap(*bptr);
   }

   _al_vector_free(&copy);

   al_unlock_mutex(convert_bitmap_list.mutex);

   al_restore_state(&backup);
}